

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
grow(container_buffer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,size_t capacity)

{
  std::__cxx11::string::resize((ulong)this->container_);
  (this->super_basic_buffer<char>).ptr_ = (this->container_->_M_dataplus)._M_p;
  (this->super_basic_buffer<char>).capacity_ = capacity;
  return;
}

Assistant:

void grow(std::size_t capacity) FMT_OVERRIDE {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }